

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

bool __thiscall google::protobuf::internal::ExtensionSet::Has(ExtensionSet *this,int number)

{
  LogMessage *other;
  LogFinisher local_75 [20];
  byte local_61;
  LogMessage local_60;
  Extension *local_28;
  Extension *ext;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  ext._4_4_ = number;
  pEStack_18 = this;
  local_28 = FindOrNull(this,number);
  if (local_28 == (Extension *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    local_61 = 0;
    if ((local_28->is_repeated & 1U) != 0) {
      LogMessage::LogMessage
                (&local_60,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0xf6);
      local_61 = 1;
      other = LogMessage::operator<<(&local_60,"CHECK failed: !ext->is_repeated: ");
      LogFinisher::operator=(local_75,other);
    }
    if ((local_61 & 1) != 0) {
      LogMessage::~LogMessage(&local_60);
    }
    this_local._7_1_ = (bool)((local_28->field_0xa & 0xf ^ 0xff) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool ExtensionSet::Has(int number) const {
  const Extension* ext = FindOrNull(number);
  if (ext == nullptr) return false;
  GOOGLE_DCHECK(!ext->is_repeated);
  return !ext->is_cleared;
}